

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHelper.hh
# Opt level: O0

QPDFObjectHelper * __thiscall
QPDFObjectHelper::operator=(QPDFObjectHelper *this,QPDFObjectHelper *param_1)

{
  QPDFObjectHelper *param_1_local;
  QPDFObjectHelper *this_local;
  
  ::qpdf::BaseHandle::operator=(&this->super_BaseHandle,&param_1->super_BaseHandle);
  QPDFObjectHandle::operator=(&this->oh_,&param_1->oh_);
  return this;
}

Assistant:

class QPDF_DLL_CLASS QPDFObjectHelper: public qpdf::BaseHandle
{
  public:
    QPDFObjectHelper(QPDFObjectHandle oh) :
        qpdf::BaseHandle(oh.getObj())
    {
    }
    QPDF_DLL
    virtual ~QPDFObjectHelper();
    QPDFObjectHandle
    getObjectHandle()
    {
        return {obj};
    }
    QPDFObjectHandle const
    getObjectHandle() const
    {
        return {obj};
    }

  protected:
    QPDF_DLL_PRIVATE
    QPDFObjectHandle
    oh()
    {
        return {obj};
    }